

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O0

int LiteScript::Syntax::ReadControlFor
              (char *text,
              vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl,
              ErrorType *errorType)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  reference pvVar5;
  Instruction local_168;
  allocator local_151;
  string local_150 [32];
  Instruction local_130;
  allocator local_119;
  string local_118 [32];
  int local_f8;
  int local_f4;
  int sz;
  int it;
  Instruction local_e0;
  int local_cc;
  undefined1 local_c8 [4];
  int jex;
  Instruction local_b8;
  Instruction local_a8;
  Instruction local_98;
  Instruction local_88;
  int local_78;
  int local_74;
  int jb;
  int jc;
  int local_60;
  int local_5c;
  int tmp;
  int i;
  string local_48 [8];
  string keyword;
  ErrorType *errorType_local;
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl_local;
  char *text_local;
  
  std::__cxx11::string::string(local_48);
  uVar3 = ReadName(text,(string *)local_48);
  if ((uVar3 == 0) ||
     (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,"for"), bVar2)) {
    text_local._4_4_ = 0;
  }
  else {
    local_5c = 3;
    uVar3 = ReadWhitespace(text + 3);
    local_5c = uVar3 + local_5c;
    if (text[local_5c] == '(') {
      local_5c = local_5c + 1;
      uVar3 = ReadWhitespace(text + local_5c);
      local_5c = uVar3 + local_5c;
      if (text[local_5c] != ';') {
        local_60 = ReadVariableDefinition(text + local_5c,instrl,errorType);
        if (local_60 < 1) {
          if (local_60 < 0) {
            text_local._4_4_ = local_60 - local_5c;
            goto LAB_001749a8;
          }
          local_60 = ReadExpression(text + local_5c,instrl,errorType);
          if (local_60 < 1) {
            if (local_60 < 0) {
              text_local._4_4_ = local_60 - local_5c;
            }
            else {
              *errorType = SCRPT_ERROR_FOR_INITIALISATION;
              text_local._4_4_ = -local_5c;
            }
            goto LAB_001749a8;
          }
          local_5c = local_5c + local_60;
          Instruction::Instruction((Instruction *)&jb,INSTR_VALUE_POP);
          std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
                    (instrl,(value_type *)&jb);
          Instruction::~Instruction((Instruction *)&jb);
        }
        else {
          local_5c = local_60 + local_5c;
        }
        uVar3 = ReadWhitespace(text + local_5c);
        local_5c = uVar3 + local_5c;
        if (text[local_5c] != ';') {
          *errorType = SCRPT_ERROR_SEMICOLON;
          text_local._4_4_ = -local_5c;
          goto LAB_001749a8;
        }
      }
      local_5c = local_5c + 1;
      uVar3 = ReadWhitespace(text + local_5c);
      local_5c = local_5c + uVar3;
      sVar4 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::size
                        (instrl);
      local_74 = (int)sVar4;
      local_60 = ReadExpression(text + local_5c,instrl,errorType);
      if (local_60 < 1) {
        if (local_60 == 0) {
          *errorType = SCRPT_ERROR_FOR_CONDITION;
          text_local._4_4_ = -local_5c;
        }
        else {
          text_local._4_4_ = local_60 - local_5c;
        }
      }
      else {
        local_5c = local_60 + local_5c;
        uVar3 = ReadWhitespace(text + local_5c);
        local_5c = uVar3 + local_5c;
        if (text[local_5c] == ';') {
          local_5c = local_5c + 1;
          uVar3 = ReadWhitespace(text + local_5c);
          local_5c = local_5c + uVar3;
          sVar4 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                  size(instrl);
          local_78 = (int)sVar4;
          Instruction::Instruction(&local_88,INSTR_JUMP_ELSE);
          std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
                    (instrl,&local_88);
          Instruction::~Instruction(&local_88);
          Instruction::Instruction(&local_98,INSTR_JUMP_TO);
          std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
                    (instrl,&local_98);
          Instruction::~Instruction(&local_98);
          local_60 = ReadExpression(text + local_5c,instrl,errorType);
          if (local_60 < 1) {
            if (local_60 < 0) {
              text_local._4_4_ = local_60 - local_5c;
              goto LAB_001749a8;
            }
          }
          else {
            local_5c = local_5c + local_60;
            Instruction::Instruction(&local_a8,INSTR_VALUE_POP);
            std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
            push_back(instrl,&local_a8);
            Instruction::~Instruction(&local_a8);
          }
          uVar3 = ReadWhitespace(text + local_5c);
          local_5c = local_5c + uVar3;
          Instruction::Instruction(&local_b8,INSTR_JUMP_TO,local_74);
          std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
                    (instrl,&local_b8);
          Instruction::~Instruction(&local_b8);
          sVar4 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                  size(instrl);
          Instruction::Instruction((Instruction *)local_c8,INSTR_JUMP_TO,(int)sVar4);
          pvVar5 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                   operator[](instrl,(long)(local_78 + 1));
          Instruction::operator=(pvVar5,(Instruction *)local_c8);
          Instruction::~Instruction((Instruction *)local_c8);
          if (text[local_5c] == ')') {
            local_5c = local_5c + 1;
            uVar3 = ReadWhitespace(text + local_5c);
            local_5c = local_5c + uVar3;
            sVar4 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                    size(instrl);
            local_cc = (int)sVar4;
            local_60 = ReadInstruction(text + local_5c,instrl,errorType);
            if (local_60 < 1) {
              if (local_60 == 0) {
                *errorType = SCRPT_ERROR_INSTRUCTION;
                text_local._4_4_ = -local_5c;
              }
              else {
                text_local._4_4_ = local_60 - local_5c;
              }
            }
            else {
              local_5c = local_5c + local_60;
              Instruction::Instruction(&local_e0,INSTR_JUMP_TO,local_78 + 2);
              std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
              push_back(instrl,&local_e0);
              Instruction::~Instruction(&local_e0);
              sVar4 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                      ::size(instrl);
              Instruction::Instruction((Instruction *)&sz,INSTR_JUMP_ELSE,(int)sVar4);
              pvVar5 = std::
                       vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                       operator[](instrl,(long)local_78);
              Instruction::operator=(pvVar5,(Instruction *)&sz);
              Instruction::~Instruction((Instruction *)&sz);
              local_f4 = local_cc;
              sVar4 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                      ::size(instrl);
              local_f8 = (int)sVar4 + -1;
              for (; local_f4 < local_f8; local_f4 = local_f4 + 1) {
                pvVar5 = std::
                         vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
                         operator[](instrl,(long)local_f4);
                if ((pvVar5->code == ';') &&
                   (pvVar5 = std::
                             vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                             ::operator[](instrl,(long)local_f4), pvVar5->comp_type == '\x04')) {
                  pvVar5 = std::
                           vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                           ::operator[](instrl,(long)local_f4);
                  pcVar1 = (pvVar5->comp_value).v_string;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_118,pcVar1,&local_119);
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_118,"break");
                  std::__cxx11::string::~string(local_118);
                  std::allocator<char>::~allocator((allocator<char> *)&local_119);
                  if (bVar2) {
                    Instruction::Instruction(&local_130,INSTR_JUMP_TO,local_f8 + 1);
                    pvVar5 = std::
                             vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                             ::operator[](instrl,(long)local_f4);
                    Instruction::operator=(pvVar5,&local_130);
                    Instruction::~Instruction(&local_130);
                  }
                  else {
                    pvVar5 = std::
                             vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                             ::operator[](instrl,(long)local_f4);
                    pcVar1 = (pvVar5->comp_value).v_string;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_150,pcVar1,&local_151);
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_150,"continue");
                    std::__cxx11::string::~string(local_150);
                    std::allocator<char>::~allocator((allocator<char> *)&local_151);
                    if (bVar2) {
                      Instruction::Instruction(&local_168,INSTR_JUMP_TO,local_78 + 2);
                      pvVar5 = std::
                               vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                               ::operator[](instrl,(long)local_f4);
                      Instruction::operator=(pvVar5,&local_168);
                      Instruction::~Instruction(&local_168);
                    }
                  }
                }
              }
              text_local._4_4_ = local_5c;
            }
          }
          else {
            *errorType = SCRPT_ERROR_PARENTHESIS_CLOSE;
            text_local._4_4_ = -local_5c;
          }
        }
        else {
          *errorType = SCRPT_ERROR_SEMICOLON;
          text_local._4_4_ = -local_5c;
        }
      }
    }
    else {
      *errorType = SCRPT_ERROR_PARENTHESIS_OPEN;
      text_local._4_4_ = -local_5c;
    }
  }
LAB_001749a8:
  tmp = 1;
  std::__cxx11::string::~string(local_48);
  return text_local._4_4_;
}

Assistant:

int LiteScript::Syntax::ReadControlFor(const char *text, std::vector<Instruction> &instrl,
                                         Script::ErrorType &errorType) {
    std::string keyword;
    if (ReadName(text, keyword) == 0 || keyword != "for")
        return 0;
    int i = 3, tmp;
    i += (int)ReadWhitespace(text + i);
    if (text[i] != '(') {
        errorType = Script::ErrorType::SCRPT_ERROR_PARENTHESIS_OPEN;
        return -i;
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    if (text[i] != ';') {
        if ((tmp = ReadVariableDefinition(text + i, instrl, errorType)) > 0)
            i += tmp;
        else if (tmp < 0)
            return tmp - i;
        else if ((tmp = ReadExpression(text + i, instrl, errorType)) > 0) {
            i += tmp;
            instrl.push_back(Instruction(InstrCode::INSTR_VALUE_POP));
        }
        else if (tmp < 0)
            return tmp - i;
        else {
            errorType = Script::ErrorType::SCRPT_ERROR_FOR_INITIALISATION;
            return -i;
        }
        i += (int)ReadWhitespace(text + i);
        if (text[i] != ';') {
            errorType = Script::ErrorType::SCRPT_ERROR_SEMICOLON;
            return -i;
        }
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    int jc = instrl.size();
    if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
        if (tmp != 0)
            return tmp - i;
        else {
            errorType = Script::ErrorType::SCRPT_ERROR_FOR_CONDITION;
            return -i;
        }
    }
    i += tmp;
    i += (int)ReadWhitespace(text + i);
    if (text[i] != ';') {
        errorType = Script::ErrorType::SCRPT_ERROR_SEMICOLON;
        return -i;
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    int jb = instrl.size();
    instrl.push_back(Instruction(InstrCode::INSTR_JUMP_ELSE));
    instrl.push_back(Instruction(InstrCode::INSTR_JUMP_TO));
    if ((tmp = ReadExpression(text + i, instrl, errorType)) > 0) {
        i += tmp;
        instrl.push_back(Instruction(InstrCode::INSTR_VALUE_POP));
    }
    else if (tmp < 0)
        return tmp - i;
    i += (int)ReadWhitespace(text + i);
    instrl.push_back(Instruction(InstrCode::INSTR_JUMP_TO, jc));
    instrl[jb + 1] = Instruction(InstrCode::INSTR_JUMP_TO, (int)instrl.size());
    if (text[i] != ')') {
        errorType = Script::ErrorType::SCRPT_ERROR_PARENTHESIS_CLOSE;
        return -i;
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    int jex = instrl.size();
    if ((tmp = ReadInstruction(text + i, instrl, errorType)) <= 0) {
        if (tmp != 0)
            return tmp - i;
        else {
            errorType = Script::ErrorType::SCRPT_ERROR_INSTRUCTION;
            return -i;
        }
    }
    i += tmp;
    instrl.push_back(Instruction(InstrCode::INSTR_JUMP_TO, jb + 2));
    instrl[jb] = Instruction(InstrCode::INSTR_JUMP_ELSE, (int)instrl.size());
    for (int it = jex, sz = instrl.size() - 1; it < sz; it++) {
        if (instrl[it].code == InstrCode::INSTR_JUMP_TO &&
            instrl[it].comp_type == Instruction::CompType::COMP_TYPE_STRING) {
            if (std::string(instrl[it].comp_value.v_string) == "break")
                instrl[it] = Instruction(InstrCode::INSTR_JUMP_TO, sz + 1);
            else if (std::string(instrl[it].comp_value.v_string) == "continue")
                instrl[it] = Instruction(InstrCode::INSTR_JUMP_TO, jb + 2);
        }
    }
    return i;
}